

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRasterizationTests.cpp
# Opt level: O0

void __thiscall
vkt::rasterization::anon_unknown_0::CullingTestInstance::CullingTestInstance
          (CullingTestInstance *this,Context *context,VkCullModeFlags cullMode,
          VkPrimitiveTopology primitiveTopology,VkFrontFace frontFace,VkPolygonMode polygonMode)

{
  VkPolygonMode polygonMode_local;
  VkFrontFace frontFace_local;
  VkPrimitiveTopology primitiveTopology_local;
  VkCullModeFlags cullMode_local;
  Context *context_local;
  CullingTestInstance *this_local;
  
  BaseRenderingTestInstance::BaseRenderingTestInstance
            (&this->super_BaseRenderingTestInstance,context,VK_SAMPLE_COUNT_1_BIT,0x100);
  (this->super_BaseRenderingTestInstance).super_TestInstance._vptr_TestInstance =
       (_func_int **)&PTR__CullingTestInstance_016b2a10;
  this->m_cullMode = cullMode;
  this->m_primitiveTopology = primitiveTopology;
  this->m_frontFace = frontFace;
  this->m_polygonMode = polygonMode;
  this->m_multisampling = true;
  return;
}

Assistant:

CullingTestInstance				(Context& context, VkCullModeFlags cullMode, VkPrimitiveTopology primitiveTopology, VkFrontFace frontFace, VkPolygonMode polygonMode)
														: BaseRenderingTestInstance		(context, VK_SAMPLE_COUNT_1_BIT, DEFAULT_RENDER_SIZE)
														, m_cullMode					(cullMode)
														, m_primitiveTopology			(primitiveTopology)
														, m_frontFace					(frontFace)
														, m_polygonMode					(polygonMode)
														, m_multisampling				(true)
													{}